

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsUtils.cpp
# Opt level: O2

void * Js::UnboxAsmJsArguments(ScriptFunction *func,Var *origArgs,char *argDst,CallInfo callInfo)

{
  char *pcVar1;
  Type p_Var2;
  code *pcVar3;
  RecyclableObject *instance;
  Var *ppvVar4;
  bool bVar5;
  AsmJsVarType AVar6;
  uint uVar7;
  int32 iVar8;
  ProxyEntryPointInfo *pPVar9;
  undefined4 *puVar10;
  FunctionBody *this;
  AsmJsFunctionInfo *this_00;
  int64 iVar11;
  CallInfo CVar12;
  size_t sVar13;
  Var pvVar14;
  Var aValue;
  char cVar15;
  ScriptContext *pSVar16;
  ScriptContext *scriptContext;
  ArgSlot index;
  ulong uVar17;
  uint uVar18;
  float fVar19;
  double dVar20;
  undefined1 local_a8 [8];
  ArgumentReader reader;
  CallInfo callInfo_local;
  PropertyRecord *local_68;
  PropertyRecord *lowPropRecord;
  PropertyRecord *highPropRecord;
  RecyclableObject *local_50;
  ScriptContext *local_48;
  Var *local_40;
  char local_31;
  
  reader.super_Arguments.Values = (Type)callInfo;
  pPVar9 = ScriptFunction::GetEntryPointInfo(func);
  p_Var2 = pPVar9->jsMethod;
  local_40 = origArgs;
  if (p_Var2 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                ,0xb8,"(address)","address");
    if (!bVar5) {
LAB_0087f8d8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  ppvVar4 = local_40;
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  this_00 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                      ((FunctionProxy *)this);
  cVar15 = DAT_014302fc;
  local_48 = (((((func->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                 super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_a8,(CallInfo *)&reader.super_Arguments.Values,ppvVar4);
  uVar18 = (local_a8._0_4_ & 0xffffff) - 1;
  callInfo_local = (CallInfo)NAN;
  highPropRecord._0_4_ = NAN;
  uVar17 = 0;
  local_31 = cVar15;
  highPropRecord._4_4_ = uVar18;
LAB_0087f5bf:
  uVar7 = (uint)uVar17;
  if (this_00->mArgCount <= uVar7) {
    AsmJsModuleInfo::EnsureHeapAttached(func);
    return p_Var2;
  }
  index = (ArgSlot)uVar17;
  pSVar16 = (ScriptContext *)(uVar17 & 0xffff);
  AVar6 = AsmJsFunctionInfo::GetArgType(this_00,index);
  if (AVar6.which_ == Int) {
    iVar8 = 0;
    if (uVar7 < uVar18) {
      if ((cVar15 == '\0') || (bVar5 = VarIs<Js::JavascriptString>(local_40[uVar17]), !bVar5)) {
        iVar8 = JavascriptMath::ToInt32(local_40[uVar17],local_48);
      }
      else {
        iVar11 = ConvertStringToInt64(local_40[uVar17],pSVar16);
        iVar8 = (int32)iVar11;
      }
    }
    pcVar1 = argDst + uVar17 * 8 + 8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(int32 *)(argDst + uVar17 * 8 + 8) = iVar8;
  }
  else {
    pSVar16 = (ScriptContext *)(uVar17 & 0xffff);
    AVar6 = AsmJsFunctionInfo::GetArgType(this_00,index);
    ppvVar4 = local_40;
    if (AVar6.which_ == Int64) {
      scriptContext = local_48;
      if (cVar15 == '\0') {
LAB_0087f8cc:
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e49f,(PCWSTR)0x0);
      }
      if (uVar7 < uVar18) {
        bVar5 = VarIs<Js::JavascriptString>(local_40[uVar17]);
        pvVar14 = ppvVar4[uVar17];
        if (bVar5) {
          iVar11 = ConvertStringToInt64(pvVar14,pSVar16);
          cVar15 = local_31;
        }
        else {
          bVar5 = DynamicObject::IsBaseDynamicObject(pvVar14);
          pvVar14 = ppvVar4[uVar17];
          if (bVar5) {
            local_50 = VarTo<Js::RecyclableObject>(pvVar14);
            pSVar16 = local_48;
            local_68 = (PropertyRecord *)0x0;
            lowPropRecord = (PropertyRecord *)0x0;
            sVar13 = PAL_wcslen(L"low");
            ScriptContext::GetOrAddPropertyRecord(pSVar16,L"low",(int)sVar13,&local_68);
            sVar13 = PAL_wcslen(L"high");
            ScriptContext::GetOrAddPropertyRecord(pSVar16,L"high",(int)sVar13,&lowPropRecord);
            instance = local_50;
            pvVar14 = JavascriptOperators::OP_GetProperty(local_50,local_68->pid,pSVar16);
            uVar18 = highPropRecord._4_4_;
            aValue = JavascriptOperators::OP_GetProperty(instance,lowPropRecord->pid,pSVar16);
            uVar7 = JavascriptMath::ToInt32(pvVar14,pSVar16);
            local_50 = (RecyclableObject *)(ulong)uVar7;
            uVar7 = JavascriptMath::ToInt32(aValue,pSVar16);
            iVar11 = ((ulong)uVar7 << 0x20) + (long)local_50;
            cVar15 = local_31;
          }
          else {
            iVar8 = JavascriptMath::ToInt32(pvVar14,local_48);
            iVar11 = (int64)iVar8;
            cVar15 = local_31;
          }
        }
      }
      else {
        iVar11 = 0;
      }
      *(int64 *)(argDst + uVar17 * 8 + 8) = iVar11;
    }
    else {
      pSVar16 = (ScriptContext *)(uVar17 & 0xffff);
      AVar6 = AsmJsFunctionInfo::GetArgType(this_00,index);
      if (AVar6.which_ == Float) {
        fVar19 = highPropRecord._0_4_;
        if (uVar7 < uVar18) {
          if ((cVar15 == '\0') || (bVar5 = VarIs<Js::JavascriptString>(local_40[uVar17]), !bVar5)) {
            dVar20 = JavascriptConversion::ToNumber(local_40[uVar17],local_48);
            fVar19 = (float)dVar20;
          }
          else {
            iVar11 = ConvertStringToInt64(local_40[uVar17],pSVar16);
            fVar19 = (float)iVar11;
          }
        }
        pcVar1 = argDst + uVar17 * 8 + 8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(float *)(argDst + uVar17 * 8 + 8) = fVar19;
      }
      else {
        pSVar16 = (ScriptContext *)(uVar17 & 0xffff);
        AVar6 = AsmJsFunctionInfo::GetArgType(this_00,index);
        scriptContext = local_48;
        if (AVar6.which_ != Double) {
          AVar6 = AsmJsFunctionInfo::GetArgType(this_00,index);
          if ((byte)(AVar6.which_ - Int32x4) < 0xb) goto LAB_0087f8cc;
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                      ,0x143,"((0))","UNREACHED");
          if (!bVar5) goto LAB_0087f8d8;
          *puVar10 = 0;
          goto LAB_0087f8cc;
        }
        CVar12 = callInfo_local;
        if (uVar7 < uVar18) {
          if ((cVar15 == '\0') || (bVar5 = VarIs<Js::JavascriptString>(local_40[uVar17]), !bVar5)) {
            CVar12 = (CallInfo)JavascriptConversion::ToNumber(local_40[uVar17],local_48);
          }
          else {
            CVar12 = (CallInfo)ConvertStringToInt64(local_40[uVar17],pSVar16);
          }
        }
        *(CallInfo *)(argDst + uVar17 * 8 + 8) = CVar12;
      }
    }
  }
  uVar17 = uVar17 + 1;
  goto LAB_0087f5bf;
}

Assistant:

void * UnboxAsmJsArguments(ScriptFunction* func, Var * origArgs, char * argDst, CallInfo callInfo)
    {
        void * address = reinterpret_cast<void*>(func->GetEntryPointInfo()->jsMethod);
        Assert(address);
        AsmJsFunctionInfo* info = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        ScriptContext* scriptContext = func->GetScriptContext();

#if ENABLE_DEBUG_CONFIG_OPTIONS
        bool allowTestInputs = CONFIG_FLAG(WasmI64);
#endif
        ArgumentReader reader(&callInfo, origArgs);
        uint actualArgCount = reader.Info.Count - 1; // -1 for ScriptFunction
        argDst = argDst + MachPtr; // add one first so as to skip the ScriptFunction argument
        for (ArgSlot i = 0; i < info->GetArgCount(); i++)
        {

            if (info->GetArgType(i).isInt())
            {
                int32 intVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        intVal = (int32)ConvertStringToInt64(*origArgs, scriptContext);
                    }
                    else
#endif
                        intVal = JavascriptMath::ToInt32(*origArgs, scriptContext);
                }
                else
                {
                    intVal = 0;
                }

#if TARGET_64
                *(int64*)(argDst) = 0;
#endif
                *(int32*)argDst = intVal;
                argDst = argDst + MachPtr;
            }
            else if (info->GetArgType(i).isInt64())
            {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (!allowTestInputs)
#endif
                {
                    JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
                }

#if ENABLE_DEBUG_CONFIG_OPTIONS
                int64 val;
                if (i < actualArgCount)
                {
                    if (VarIs<JavascriptString>(*origArgs))
                    {
                        val = ConvertStringToInt64(*origArgs, scriptContext);
                    }
                    else if (DynamicObject::IsBaseDynamicObject(*origArgs))
                    {
                        RecyclableObject* object = VarTo<RecyclableObject>(*origArgs);
                        PropertyRecord const * lowPropRecord = nullptr;
                        PropertyRecord const * highPropRecord = nullptr;
                        scriptContext->GetOrAddPropertyRecord(_u("low"), (int)wcslen(_u("low")), &lowPropRecord);
                        scriptContext->GetOrAddPropertyRecord(_u("high"), (int)wcslen(_u("high")), &highPropRecord);
                        Var low = JavascriptOperators::OP_GetProperty(object, lowPropRecord->GetPropertyId(), scriptContext);
                        Var high = JavascriptOperators::OP_GetProperty(object, highPropRecord->GetPropertyId(), scriptContext);

                        uint64 lowVal = JavascriptMath::ToInt32(low, scriptContext);
                        uint64 highVal = JavascriptMath::ToInt32(high, scriptContext);
                        val = (highVal << 32) | (lowVal & 0xFFFFFFFF);
                    }
                    else
                    {
                        int32 intVal = JavascriptMath::ToInt32(*origArgs, scriptContext);
                        val = (int64)intVal;
                    }
                }
                else
                {
                    val = 0;
                }

                *(int64*)(argDst) = val;
                argDst += sizeof(int64);
#endif
            }
            else if (info->GetArgType(i).isFloat())
            {
                float floatVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        int32 val = (int32)ConvertStringToInt64(*origArgs, scriptContext);
                        floatVal = *(float*)&val;
                    }
                    else
#endif
                        floatVal = (float)(JavascriptConversion::ToNumber(*origArgs, scriptContext));
                }
                else
                {
                    floatVal = (float)(JavascriptNumber::NaN);
                }
#if TARGET_64
                *(int64*)(argDst) = 0;
#endif
                *(float*)argDst = floatVal;
                argDst = argDst + MachPtr;
            }
            else if (info->GetArgType(i).isDouble())
            {
                double doubleVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        int64 val = ConvertStringToInt64(*origArgs, scriptContext);
                        doubleVal = *(double*)&val;
                    }
                    else
#endif
                        doubleVal = JavascriptConversion::ToNumber(*origArgs, scriptContext);
                }
                else
                {
                    doubleVal = JavascriptNumber::NaN;
                }

                *(double*)argDst = doubleVal;
                argDst = argDst + sizeof(double);
            }
            else if (info->GetArgType(i).isSIMD())
            {
                // Todo:: support test input for wasm.simd
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
            }
            else
            {
                Assert(UNREACHED);
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
            }
            ++origArgs;
        }

        AsmJsModuleInfo::EnsureHeapAttached(func);

        // for convenience, lets take the opportunity to return the asm.js entrypoint address
        return address;
    }